

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLGrammarPoolImpl.cpp
# Opt level: O1

bool __thiscall
xercesc_4_0::XMLGrammarPoolImpl::cacheGrammar(XMLGrammarPoolImpl *this,Grammar *gramToCache)

{
  RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> *pRVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  ushort *key1;
  ulong uVar4;
  ushort *puVar5;
  ushort uVar6;
  RefHashTableBucketElem<xercesc_4_0::Grammar> *pRVar7;
  
  bVar2 = false;
  if ((gramToCache != (Grammar *)0x0) && (bVar2 = false, this->fLocked == false)) {
    iVar3 = (*(gramToCache->super_XSerializable)._vptr_XSerializable[0x16])(gramToCache);
    key1 = (ushort *)
           (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x30))
                     ((long *)CONCAT44(extraout_var,iVar3));
    pRVar1 = this->fGrammarRegistry;
    if ((key1 == (ushort *)0x0) || (uVar4 = (ulong)*key1, uVar4 == 0)) {
      uVar4 = 0;
    }
    else {
      uVar6 = key1[1];
      if (uVar6 != 0) {
        puVar5 = key1 + 2;
        do {
          uVar4 = (ulong)uVar6 + (uVar4 >> 0x18) + uVar4 * 0x26;
          uVar6 = *puVar5;
          puVar5 = puVar5 + 1;
        } while (uVar6 != 0);
      }
      uVar4 = uVar4 % pRVar1->fHashModulus;
    }
    pRVar7 = pRVar1->fBucketList[uVar4];
    if (pRVar7 == (RefHashTableBucketElem<xercesc_4_0::Grammar> *)0x0) {
      bVar2 = false;
    }
    else {
      do {
        bVar2 = StringHasher::equals((StringHasher *)&pRVar1->field_0x30,key1,pRVar7->fKey);
        if (bVar2) break;
        pRVar7 = pRVar7->fNext;
      } while (pRVar7 != (RefHashTableBucketElem<xercesc_4_0::Grammar> *)0x0);
    }
    if (((bVar2 == false) &&
        (RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::put
                   (this->fGrammarRegistry,key1,gramToCache), this->fXSModelIsValid == true)) &&
       (iVar3 = (*(gramToCache->super_XSerializable)._vptr_XSerializable[5])(gramToCache),
       iVar3 == 1)) {
      this->fXSModelIsValid = false;
    }
    bVar2 = (bool)(bVar2 ^ 1);
  }
  return bVar2;
}

Assistant:

bool XMLGrammarPoolImpl::cacheGrammar(Grammar* const               gramToCache )
{
    if(fLocked || !gramToCache)
        return false;

    const XMLCh* grammarKey = gramToCache->getGrammarDescription()->getGrammarKey();

    if (fGrammarRegistry->containsKey(grammarKey))
    {
        return false;
    }

    fGrammarRegistry->put((void*) grammarKey, gramToCache);

    if (fXSModelIsValid && gramToCache->getGrammarType() == Grammar::SchemaGrammarType)
    {
        fXSModelIsValid = false;
    }
    return true;
}